

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symtab.c
# Opt level: O0

void ShowLine(int i)

{
  int i_local;
  
  if (i < 10000) {
    if (i < 1000) {
      if (i < 100) {
        if (i < 10) {
          printf("%1d\b",(ulong)(uint)i);
        }
        else {
          printf("%2d\b\b",(ulong)(uint)i);
        }
      }
      else {
        printf("%3d\b\b\b",(ulong)(uint)i);
      }
    }
    else {
      printf("%4d\b\b\b\b",(ulong)(uint)i);
    }
  }
  else {
    printf("%5d\b\b\b\b\b",(ulong)(uint)i);
  }
  fflush(_stdout);
  return;
}

Assistant:

void ShowLine(int i)
/* Shows the current line number and backs up over it. */
{
	if (i >= 10000)
		printf("%5d\b\b\b\b\b", i);
	else if (i >= 1000)
		printf("%4d\b\b\b\b", i);
	else if (i >= 100)
		printf("%3d\b\b\b", i);
	else if (i >= 10)
		printf("%2d\b\b", i);
	else
		printf("%1d\b", i);
	fflush(stdout); /* Make sure it gets out. */
}